

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseNotationDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  notationDeclSAXFunc p_Var3;
  int iVar4;
  xmlChar *in_RAX;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  char *msg;
  xmlChar *Pubid;
  xmlChar *local_28;
  
  pxVar2 = ctxt->input;
  pxVar5 = pxVar2->cur;
  if ((((((*pxVar5 != '<') || (pxVar5[1] != '!')) || (pxVar5[2] != 'N')) ||
       (((pxVar5[3] != 'O' || (pxVar5[4] != 'T')) ||
        ((pxVar5[5] != 'A' || ((pxVar5[6] != 'T' || (pxVar5[7] != 'I')))))))) || (pxVar5[8] != 'O'))
     || (pxVar5[9] != 'N')) {
    return;
  }
  iVar1 = pxVar2->id;
  local_28 = in_RAX;
  if (((ctxt->progressive == 0) && (500 < (long)pxVar5 - (long)pxVar2->base)) &&
     ((long)pxVar2->end - (long)pxVar5 < 500)) {
    xmlSHRINK(ctxt);
  }
  pxVar2 = ctxt->input;
  pxVar5 = pxVar2->cur;
  pxVar2->cur = pxVar5 + 10;
  pxVar2->col = pxVar2->col + 10;
  if (pxVar5[10] == '\0') {
    xmlParserInputGrow(pxVar2,0xfa);
  }
  iVar4 = xmlSkipBlankChars(ctxt);
  if (iVar4 == 0) {
    msg = "Space required after \'<!NOTATION\'\n";
  }
  else {
    pxVar5 = xmlParseName(ctxt);
    if (pxVar5 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
      return;
    }
    pxVar6 = xmlStrchr(pxVar5,':');
    if (pxVar6 != (xmlChar *)0x0) {
      xmlNsErr(ctxt,XML_NS_ERR_COLON,"colons are forbidden from notation names \'%s\'\n",pxVar5,
               (xmlChar *)0x0,(xmlChar *)0x0);
    }
    iVar4 = xmlSkipBlankChars(ctxt);
    if (iVar4 != 0) {
      pxVar6 = xmlParseExternalID(ctxt,&local_28,0);
      xmlSkipBlankChars(ctxt);
      if (*ctxt->input->cur == '>') {
        if (iVar1 != ctxt->input->id) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "Notation declaration doesn\'t start and stop in the same entity\n");
        }
        xmlNextChar(ctxt);
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var3 = ctxt->sax->notationDecl, p_Var3 != (notationDeclSAXFunc)0x0)) {
          (*p_Var3)(ctxt->userData,pxVar5,local_28,pxVar6);
        }
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
      }
      if (pxVar6 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar6);
      }
      if (local_28 == (xmlChar *)0x0) {
        return;
      }
      (*xmlFree)(local_28);
      return;
    }
    msg = "Space required after the NOTATION name\'\n";
  }
  xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,msg);
  return;
}

Assistant:

void
xmlParseNotationDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlChar *Pubid;
    xmlChar *Systemid;

    if (CMP10(CUR_PTR, '<', '!', 'N', 'O', 'T', 'A', 'T', 'I', 'O', 'N')) {
	int inputid = ctxt->input->id;
	SHRINK;
	SKIP(10);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '<!NOTATION'\n");
	    return;
	}

        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	    return;
	}
	if (xmlStrchr(name, ':') != NULL) {
	    xmlNsErr(ctxt, XML_NS_ERR_COLON,
		     "colons are forbidden from notation names '%s'\n",
		     name, NULL, NULL);
	}
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		     "Space required after the NOTATION name'\n");
	    return;
	}

	/*
	 * Parse the IDs.
	 */
	Systemid = xmlParseExternalID(ctxt, &Pubid, 0);
	SKIP_BLANKS;

	if (RAW == '>') {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                       "Notation declaration doesn't start and stop"
                               " in the same entity\n");
	    }
	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->notationDecl != NULL))
		ctxt->sax->notationDecl(ctxt->userData, name, Pubid, Systemid);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
	}
	if (Systemid != NULL) xmlFree(Systemid);
	if (Pubid != NULL) xmlFree(Pubid);
    }
}